

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O1

qint64 __thiscall
QHttpNetworkReplyPrivate::getChunkSize
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,qint64 *chunkSize)

{
  char *__s;
  size_t __n;
  int iVar1;
  CutResult CVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  undefined1 *puVar6;
  qint64 qVar7;
  int iVar8;
  char *b;
  char *pcVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  undefined1 auVar14 [12];
  char c;
  char crlf [2];
  long local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3a = 0xaaaa;
  *chunkSize = -1;
  iVar1 = (**(code **)(*(long *)socket + 0xa0))(socket);
  lVar10 = 0;
  do {
    if (iVar1 <= lVar10) goto LAB_0020e457;
    lVar3 = QIODevice::peek((char *)socket,(longlong)&local_3a);
    lVar4 = (this->fragment).d.size;
    if ((((lVar3 == 2) && ((int)lVar4 != 0)) && ((char)local_3a == '\r')) &&
       (local_3a._1_1_ == '\n')) {
LAB_0020e2d9:
      lVar4 = QIODevice::read((char *)socket,(longlong)&local_3a);
      lVar10 = lVar10 + lVar4;
      if ((char)local_3a == '\r') {
        lVar4 = QIODevice::read((char *)socket,(longlong)&local_3a);
        lVar10 = lVar10 + lVar4;
      }
      __s = (this->fragment).d.ptr;
      __n = (this->fragment).d.size;
      if (__n == 0) {
LAB_0020e359:
        local_60 = -1;
      }
      else {
        pvVar5 = memchr(__s,0x3b,__n);
        if (pvVar5 == (void *)0x0) goto LAB_0020e359;
        local_60 = (long)pvVar5 - (long)__s;
      }
      local_58 = (undefined1 *)0x0;
      CVar2 = QtPrivate::QContainerImplHelper::mid(__n,(qsizetype *)&local_58,&local_60);
      pcVar9 = (char *)0x0;
      lVar4 = 0;
      if (CVar2 != Null) {
        pcVar9 = __s + (long)local_58;
        lVar4 = local_60;
      }
      QVar12.m_data = pcVar9;
      QVar12.m_size = lVar4;
      auVar14 = QtPrivate::trimmed(QVar12);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QVar13.m_data = auVar14._0_8_;
      QVar13.m_size = (qsizetype)&local_58;
      QtPrivate::toSignedInteger(QVar13,auVar14._8_4_);
      puVar6 = (undefined1 *)0x0;
      if (((ulong)puStack_50 & 1) == 0) {
        puVar6 = local_58;
      }
      *chunkSize = (qint64)puVar6;
      QByteArray::clear();
      iVar8 = 3;
    }
    else {
      if (1 < (int)lVar4) {
        if (lVar4 == 0) {
          bVar11 = false;
        }
        else {
          bVar11 = (this->fragment).d.ptr[lVar4 + -1] == '\r';
        }
        if ((bool)((char)local_3a == '\n' & bVar11)) goto LAB_0020e2d9;
      }
      local_58 = (undefined1 *)((ulong)local_58 & 0xffffffffffffff00);
      lVar4 = QIODevice::read((char *)socket,(longlong)&local_58);
      if (lVar4 < 0) {
        iVar8 = 1;
      }
      else {
        lVar10 = lVar10 + lVar4;
        QByteArray::append((char)this + ' ');
        iVar8 = 0;
      }
    }
  } while (iVar8 == 0);
  qVar7 = -1;
  if (iVar8 == 3) {
LAB_0020e457:
    qVar7 = lVar10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar7;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpNetworkReplyPrivate::getChunkSize(QIODevice *socket, qint64 *chunkSize)
{
    qint64 bytes = 0;
    char crlf[2];
    *chunkSize = -1;

    int bytesAvailable = socket->bytesAvailable();
    // FIXME rewrite to permanent loop without bytesAvailable
    while (bytesAvailable > bytes) {
        qint64 sniffedBytes = socket->peek(crlf, 2);
        int fragmentSize = fragment.size();

        // check the next two bytes for a "\r\n", skip blank lines
        if ((fragmentSize && sniffedBytes == 2 && crlf[0] == '\r' && crlf[1] == '\n')
           ||(fragmentSize > 1 && fragment.endsWith('\r')  && crlf[0] == '\n'))
        {
            bytes += socket->read(crlf, 1);     // read the \r or \n
            if (crlf[0] == '\r')
                bytes += socket->read(crlf, 1); // read the \n
            bool ok = false;
            // ignore the chunk-extension
            const auto fragmentView = QByteArrayView(fragment).mid(0, fragment.indexOf(';')).trimmed();
            *chunkSize = fragmentView.toLong(&ok, 16);
            fragment.clear();
            break; // size done
        } else {
            // read the fragment to the buffer
            char c = 0;
            qint64 haveRead = socket->read(&c, 1);
            if (haveRead < 0) {
                return -1; // FIXME
            }
            bytes += haveRead;
            fragment.append(c);
        }
    }

    return bytes;
}